

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

uint8 GetCellEdgeIncidenceMask(S2Cell *cell,S2Point *p,double tolerance_uv)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  R2Point uv;
  R2Rect bound;
  R2Rect local_38;
  S2LogMessage local_18;
  
  uv.c_[0] = 0.0;
  uv.c_[1] = 0.0;
  bVar1 = S2::FaceXYZtoUV((int)cell->face_,p,&uv);
  if (bVar1) {
    bound.bounds_[0].bounds_.c_[0] = (cell->uv_).bounds_[0].bounds_.c_[0];
    bound.bounds_[0].bounds_.c_[1] = (cell->uv_).bounds_[0].bounds_.c_[1];
    bound.bounds_[1].bounds_.c_[0] = (cell->uv_).bounds_[1].bounds_.c_[0];
    bound.bounds_[1].bounds_.c_[1] = (cell->uv_).bounds_[1].bounds_.c_[1];
    if (FLAGS_s2debug == false) {
      uVar4 = SUB84(uv.c_[0],0);
      uVar5 = (undefined4)((ulong)uv.c_[0] >> 0x20);
    }
    else {
      R2Rect::Expanded(&local_38,&bound,tolerance_uv);
      uVar4 = SUB84(uv.c_[0],0);
      uVar5 = (undefined4)((ulong)uv.c_[0] >> 0x20);
      if ((((uv.c_[0] < local_38.bounds_[0].bounds_.c_[0]) ||
           (local_38.bounds_[0].bounds_.c_[1] < uv.c_[0])) ||
          (uv.c_[1] < local_38.bounds_[1].bounds_.c_[0])) ||
         (local_38.bounds_[1].bounds_.c_[1] < uv.c_[1])) {
        S2LogMessage::S2LogMessage
                  (&local_18,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                   ,0x400,kFatal,(ostream *)&std::cerr);
        std::operator<<(local_18.stream_,"Check failed: bound.Expanded(tolerance_uv).Contains(uv) ")
        ;
        abort();
      }
    }
    bVar1 = ABS(uv.c_[1] - bound.bounds_[1].bounds_.c_[0]) <= tolerance_uv;
    bVar2 = bVar1 + 2;
    if (tolerance_uv < ABS((double)CONCAT44(uVar5,uVar4) - bound.bounds_[0].bounds_.c_[1])) {
      bVar2 = bVar1;
    }
    bVar3 = bVar2 + 4;
    if (tolerance_uv < ABS(uv.c_[1] - bound.bounds_[1].bounds_.c_[1])) {
      bVar3 = bVar2;
    }
    bVar2 = bVar3 | 8;
    if (tolerance_uv < ABS((double)CONCAT44(uVar5,uVar4) - bound.bounds_[0].bounds_.c_[0])) {
      bVar2 = bVar3;
    }
  }
  else {
    bVar2 = 0;
  }
  return bVar2;
}

Assistant:

uint8 GetCellEdgeIncidenceMask(const S2Cell& cell, const S2Point& p,
                               double tolerance_uv) {
  uint8 mask = 0;
  R2Point uv;
  if (S2::FaceXYZtoUV(cell.face(), p, &uv)) {
    R2Rect bound = cell.GetBoundUV();
    if (FLAGS_s2debug) S2_DCHECK(bound.Expanded(tolerance_uv).Contains(uv));
    if (fabs(uv[1] - bound[1][0]) <= tolerance_uv) mask |= 1;
    if (fabs(uv[0] - bound[0][1]) <= tolerance_uv) mask |= 2;
    if (fabs(uv[1] - bound[1][1]) <= tolerance_uv) mask |= 4;
    if (fabs(uv[0] - bound[0][0]) <= tolerance_uv) mask |= 8;
  }
  return mask;
}